

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O2

bool __thiscall duckdb::CSVErrorHandler::PrintLineNumber(CSVErrorHandler *this,CSVError *error)

{
  byte bVar1;
  
  if ((this->print_line == true) && (error->type < INVALID_STATE)) {
    bVar1 = (byte)(0x1dd >> (error->type & 0x1f));
  }
  else {
    bVar1 = 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool CSVErrorHandler::PrintLineNumber(const CSVError &error) const {
	if (!print_line) {
		return false;
	}
	switch (error.type) {
	case CAST_ERROR:
	case UNTERMINATED_QUOTES:
	case TOO_FEW_COLUMNS:
	case TOO_MANY_COLUMNS:
	case MAXIMUM_LINE_SIZE:
	case NULLPADDED_QUOTED_NEW_VALUE:
	case INVALID_UNICODE:
		return true;
	default:
		return false;
	}
}